

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_versions.cc
# Opt level: O1

bool bssl::ssl_supports_version(SSL_HANDSHAKE *hs,uint16_t version)

{
  ulong uVar1;
  bool bVar2;
  uint16_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint16_t protocol_version;
  ushort local_a;
  
  bVar2 = hs->ssl->method->is_dtls;
  puVar3 = &kTLSVersions;
  if (bVar2 != false) {
    puVar3 = &kDTLSVersions;
  }
  if (*puVar3 != version) {
    uVar4 = (ulong)((4 - (uint)bVar2) * 2);
    uVar1 = 2;
    do {
      uVar5 = uVar1;
      if (uVar4 == uVar5) {
        return false;
      }
      uVar1 = uVar5 + 2;
    } while (*(uint16_t *)((long)puVar3 + uVar5) != version);
    if (uVar4 == uVar5) {
      return false;
    }
  }
  bVar2 = ssl_protocol_version_from_wire(&local_a,version);
  if ((bVar2) && (hs->min_version <= local_a)) {
    return local_a <= hs->max_version;
  }
  return false;
}

Assistant:

bool ssl_supports_version(const SSL_HANDSHAKE *hs, uint16_t version) {
  const SSL *const ssl = hs->ssl;
  uint16_t protocol_version;
  if (!ssl_method_supports_version(ssl->method, version) ||
      !ssl_protocol_version_from_wire(&protocol_version, version) ||
      hs->min_version > protocol_version ||
      protocol_version > hs->max_version) {
    return false;
  }

  return true;
}